

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O3

ALLEGRO_BITMAP * ObtainBitmap(char *name)

{
  int iVar1;
  char *__s1;
  char **ppcVar2;
  
  if ((demo_data != (DATA_ENTRY *)0x0) && (__s1 = demo_data->name, __s1 != (char *)0x0)) {
    ppcVar2 = &demo_data[1].name;
    do {
      iVar1 = strcmp(ppcVar2[-0xb],"bitmap");
      if ((iVar1 == 0) && (iVar1 = strcmp(__s1,name), iVar1 == 0)) {
        return (ALLEGRO_BITMAP *)ppcVar2[-5];
      }
      __s1 = *ppcVar2;
      ppcVar2 = ppcVar2 + 8;
    } while (__s1 != (char *)0x0);
  }
  return (ALLEGRO_BITMAP *)0x0;
}

Assistant:

ALLEGRO_BITMAP *ObtainBitmap(const char *name)
{
   DATA_ENTRY *data = demo_data;
   while (data && data->name) {
      if (!strcmp(data->type, "bitmap") &&
         !strcmp(data->name, name)) return data->dat;
      data++;
   }
   return NULL;
}